

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O3

size_t duckdb_zstd::HUF_decompress1X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  ushort uVar1;
  char cVar2;
  size_t sVar3;
  byte bVar4;
  uint uVar5;
  undefined1 *puVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar3 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar3;
  }
  if ((flags & 1U) != 0) {
    if (cSrcSize == 0) {
      return 0xffffffffffffffb8;
    }
    puVar6 = (undefined1 *)((~((long)maxDstSize >> 0x3f) & maxDstSize) + (long)dst);
    uVar1 = *(ushort *)((long)DTable + 2);
    if (cSrcSize < 8) {
      uVar12 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar12 = uVar12 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar12 = uVar12 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar12 = uVar12 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      }
      bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar4 == 0) {
        return 0xffffffffffffffec;
      }
      uVar14 = (ulong)(LZCOUNT((uint)bVar4) + (int)cSrcSize * -8 + 0x29);
      puVar10 = (ulong *)cSrc;
      if ((long)maxDstSize < 4) goto LAB_01d8577b;
      uVar11 = 0;
    }
    else {
      bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar4 == 0) {
        return 0xffffffffffffffff;
      }
      if (0xffffffffffffff88 < cSrcSize) {
        return cSrcSize;
      }
      uVar11 = cSrcSize - 8;
      uVar12 = *(ulong *)((long)cSrc + (cSrcSize - 8));
      uVar7 = (LZCOUNT((uint)bVar4) ^ 0xffffffe0U) + 9;
      uVar14 = (ulong)uVar7;
      if ((long)maxDstSize < 4) {
        puVar10 = (ulong *)((long)cSrc + uVar11);
        if ((long)cSrcSize < 0x10) {
          if (uVar11 == 0) goto LAB_01d8577b;
          uVar11 = uVar11 & 0xffffffff;
          if (cSrc <= (void *)((long)puVar10 - (ulong)(uVar7 >> 3))) {
            uVar11 = (ulong)(uVar7 >> 3);
          }
          uVar7 = uVar7 + (int)uVar11 * -8;
        }
        else {
          uVar11 = (ulong)(uVar7 >> 3);
          uVar7 = uVar7 & 7;
        }
        uVar14 = (ulong)uVar7;
        uVar12 = *(ulong *)((long)puVar10 - uVar11);
        puVar10 = (ulong *)((long)puVar10 - uVar11);
        goto LAB_01d8577b;
      }
    }
    uVar7 = -(uint)uVar1 & 0x3f;
    do {
      if ((long)uVar11 < 8) {
        puVar10 = (ulong *)((long)cSrc + uVar11);
        if (uVar11 == 0) goto LAB_01d8577b;
        uVar5 = (uint)(uVar14 >> 3);
        bVar15 = cSrc <= (void *)((long)((long)cSrc + uVar11) - (uVar14 >> 3));
        if (!bVar15) {
          uVar5 = (uint)uVar11;
        }
        uVar9 = (uint)uVar14 + uVar5 * -8;
      }
      else {
        uVar5 = (uint)(uVar14 >> 3);
        uVar9 = (uint)uVar14 & 7;
        bVar15 = true;
      }
      uVar14 = (ulong)uVar9;
      uVar11 = uVar11 - uVar5;
      uVar12 = *(ulong *)((long)cSrc + uVar11);
      if ((puVar6 + -3 <= dst) || (!bVar15)) {
        puVar10 = (ulong *)(uVar11 + (long)cSrc);
        goto LAB_01d8577b;
      }
      uVar14 = (uVar12 << (uVar14 & 0x3f)) >> uVar7;
      uVar9 = *(byte *)((long)DTable + uVar14 * 2 + 4) + uVar9;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      uVar14 = (uVar12 << ((ulong)uVar9 & 0x3f)) >> uVar7;
      uVar9 = *(byte *)((long)DTable + uVar14 * 2 + 4) + uVar9;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      uVar14 = (uVar12 << ((ulong)uVar9 & 0x3f)) >> uVar7;
      uVar9 = *(byte *)((long)DTable + uVar14 * 2 + 4) + uVar9;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      uVar13 = (uVar12 << ((ulong)uVar9 & 0x3f)) >> uVar7;
      uVar9 = *(byte *)((long)DTable + uVar13 * 2 + 4) + uVar9;
      uVar14 = (ulong)uVar9;
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      dst = (void *)((long)dst + 4);
    } while (uVar9 < 0x41);
    puVar10 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
LAB_01d8577b:
    if (dst < puVar6) {
      do {
        uVar11 = (uVar12 << (uVar14 & 0x3f)) >> (-(uint)uVar1 & 0x3f);
        uVar7 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + (int)uVar14;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
        dst = (void *)((long)dst + 1);
        uVar14 = (ulong)uVar7;
      } while (dst < puVar6);
    }
    else {
      uVar7 = (uint)uVar14;
    }
    if (uVar7 != 0x40) {
      maxDstSize = 0xffffffffffffffec;
    }
    if (puVar10 != (ulong *)cSrc) {
      maxDstSize = 0xffffffffffffffec;
    }
    return maxDstSize;
  }
  sVar3 = 0;
  if (0 < (long)maxDstSize) {
    sVar3 = maxDstSize;
  }
  if (cSrcSize == 0) {
    return 0xffffffffffffffb8;
  }
  puVar6 = (undefined1 *)(sVar3 + (long)dst);
  cVar2 = (char)*(undefined2 *)((long)DTable + 2);
  if (cSrcSize < 8) {
    uVar12 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar12 = uVar12 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar12 = uVar12 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar12 = uVar12 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar4 == 0) {
      return 0xffffffffffffffec;
    }
    uVar7 = 0x1f;
    if (bVar4 != 0) {
      for (; bVar4 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = (uVar7 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
    puVar10 = (ulong *)cSrc;
    if ((long)maxDstSize < 4) goto LAB_01d819a8;
    uVar14 = 0;
  }
  else {
    bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar4 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    uVar14 = cSrcSize - 8;
    uVar12 = *(ulong *)((long)cSrc + (cSrcSize - 8));
    uVar7 = 0x1f;
    if (bVar4 != 0) {
      for (; bVar4 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = ~uVar7 + 9;
    if ((long)maxDstSize < 4) {
      puVar10 = (ulong *)((long)cSrc + (cSrcSize - 8));
      if ((long)cSrcSize < 0x10) {
        if (uVar14 == 0) goto LAB_01d819a8;
        uVar14 = uVar14 & 0xffffffff;
        if (cSrc <= (void *)((long)puVar10 - (ulong)(uVar7 >> 3))) {
          uVar14 = (ulong)(uVar7 >> 3);
        }
        uVar7 = uVar7 + (int)uVar14 * -8;
      }
      else {
        uVar14 = (ulong)(uVar7 >> 3);
        uVar7 = uVar7 & 7;
      }
      uVar12 = *(ulong *)((long)puVar10 - uVar14);
      puVar10 = (ulong *)((long)puVar10 - uVar14);
      goto LAB_01d819a8;
    }
  }
  bVar4 = -cVar2 & 0x3f;
  do {
    if ((long)uVar14 < 8) {
      puVar10 = (ulong *)((long)cSrc + uVar14);
      if (uVar14 == 0) goto LAB_01d819a8;
      uVar5 = uVar7 >> 3;
      bVar15 = cSrc <= (void *)((long)((long)cSrc + uVar14) - (ulong)uVar5);
      if (!bVar15) {
        uVar5 = (uint)uVar14;
      }
      uVar7 = uVar7 + uVar5 * -8;
    }
    else {
      uVar5 = uVar7 >> 3;
      uVar7 = uVar7 & 7;
      bVar15 = true;
    }
    uVar14 = uVar14 - uVar5;
    uVar12 = *(ulong *)((long)cSrc + uVar14);
    if ((puVar6 + -3 <= dst) || (!bVar15)) {
      puVar10 = (ulong *)(uVar14 + (long)cSrc);
      goto LAB_01d819a8;
    }
    uVar11 = (uVar12 << ((byte)uVar7 & 0x3f)) >> bVar4;
    iVar8 = *(byte *)((long)DTable + uVar11 * 2 + 4) + uVar7;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
    uVar11 = (uVar12 << ((byte)iVar8 & 0x3f)) >> bVar4;
    iVar8 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar8;
    uVar13 = (uVar12 << ((byte)iVar8 & 0x3f)) >> bVar4;
    *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
    iVar8 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar8;
    uVar11 = (uVar12 << ((byte)iVar8 & 0x3f)) >> bVar4;
    *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
    uVar7 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar8;
    *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
    dst = (void *)((long)dst + 4);
  } while (uVar7 < 0x41);
  puVar10 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
LAB_01d819a8:
  if (dst < puVar6) {
    do {
      uVar14 = (uVar12 << ((byte)uVar7 & 0x3f)) >> (-cVar2 & 0x3fU);
      uVar7 = uVar7 + *(byte *)((long)DTable + uVar14 * 2 + 4);
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < puVar6);
  }
  if (uVar7 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puVar10 != (ulong *)cSrc) {
    maxDstSize = 0xffffffffffffffec;
  }
  return maxDstSize;
}

Assistant:

size_t HUF_decompress1X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}